

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DotMemberClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DotMemberClauseSyntax,slang::syntax::DotMemberClauseSyntax_const&>
          (BumpAllocator *this,DotMemberClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  DotMemberClauseSyntax *pDVar13;
  
  pDVar13 = (DotMemberClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DotMemberClauseSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DotMemberClauseSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->member).info = (args->member).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->dot).kind;
  uVar8 = (args->dot).field_0x2;
  NVar9.raw = (args->dot).numFlags.raw;
  uVar10 = (args->dot).rawLen;
  TVar3 = (args->member).kind;
  uVar4 = (args->member).field_0x2;
  NVar5.raw = (args->member).numFlags.raw;
  uVar6 = (args->member).rawLen;
  (pDVar13->dot).info = (args->dot).info;
  (pDVar13->member).kind = TVar3;
  (pDVar13->member).field_0x2 = uVar4;
  (pDVar13->member).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar13->member).rawLen = uVar6;
  (pDVar13->super_SyntaxNode).previewNode = pSVar2;
  (pDVar13->dot).kind = TVar7;
  (pDVar13->dot).field_0x2 = uVar8;
  (pDVar13->dot).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar13->dot).rawLen = uVar10;
  (pDVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pDVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pDVar13->super_SyntaxNode).parent = pSVar1;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }